

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

void __thiscall
CVmObjVector::new_live_iterator(CVmObjVector *this,vm_val_t *retval,vm_val_t *self_val)

{
  vm_obj_id_t vVar1;
  
  vVar1 = CVmObjIterIdx::create_for_coll
                    (self_val,1,
                     (ulong)*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2));
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar1;
  return;
}

Assistant:

void CVmObjVector::new_live_iterator(VMG_ vm_val_t *retval,
                                     const vm_val_t *self_val)
{
    /* 
     *   Set up a new indexed iterator object.  The first valid index for a
     *   vector is always 1, and the last valid index is the same as the
     *   number of elements.  Since we want a "live" iterator, create the
     *   iterator with a direct reference to the vector.  
     */
    retval->set_obj(CVmObjIterIdx::create_for_coll(vmg_ self_val,
        1, get_element_count()));
}